

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isNearestSampleResultValid<tcu::IntLookupPrecision,unsigned_int>
               (ConstPixelBufferAccess *level,Sampler *sampler,IntLookupPrecision *prec,float coordX
               ,int coordY,Vector<unsigned_int,_4> *result)

{
  WrapMode mode;
  bool bVar1;
  int iVar2;
  int coordBits;
  int uvBits;
  uint uVar3;
  deInt32 dVar4;
  float fVar5;
  undefined1 local_60 [8];
  Vector<unsigned_int,_4> color;
  int x;
  int i;
  int maxI;
  int minI;
  Vec2 uBounds;
  Vector<unsigned_int,_4> *result_local;
  int coordY_local;
  float coordX_local;
  IntLookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar1 = sampler->normalizedCoords;
  uBounds.m_data = (float  [2])result;
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  coordBits = Vector<int,_3>::x(&prec->coordBits);
  uvBits = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar1 & 1),iVar2,coordX,coordBits,uvBits);
  fVar5 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  uVar3 = deFloorFloatToInt32(fVar5);
  fVar5 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar4 = deFloorFloatToInt32(fVar5);
  color.m_data[3] = uVar3;
  while( true ) {
    uVar3 = color.m_data[3];
    if (dVar4 < (int)color.m_data[3]) {
      return false;
    }
    mode = sampler->wrapS;
    iVar2 = ConstPixelBufferAccess::getWidth(level);
    color.m_data[2] = TexVerifierUtil::wrap(mode,uVar3,iVar2);
    lookup<unsigned_int>((tcu *)local_60,level,sampler,color.m_data[2],coordY,0);
    bVar1 = isColorValid(prec,(UVec4 *)local_60,(UVec4 *)uBounds.m_data);
    if (bVar1) break;
    color.m_data[3] = color.m_data[3] + 1;
  }
  return true;
}

Assistant:

static bool isNearestSampleResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const PrecType&						prec,
										const float							coordX,
										const int							coordY,
										const Vector<ScalarType, 4>&		result)
{
	DE_ASSERT(level.getDepth() == 1);

	const Vec2		uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coordX, prec.coordBits.x(), prec.uvwBits.x());

	const int		minI			= deFloorFloatToInt32(uBounds.x());
	const int		maxI			= deFloorFloatToInt32(uBounds.y());

	for (int i = minI; i <= maxI; i++)
	{
		const int					x		= wrap(sampler.wrapS, i, level.getWidth());
		const Vector<ScalarType, 4>	color	= lookup<ScalarType>(level, sampler, x, coordY, 0);

		if (isColorValid(prec, color, result))
			return true;
	}

	return false;
}